

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groupnorm_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::GroupNorm_x86_avx::forward_inplace(GroupNorm_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  _func_int **pp_Var2;
  void *pvVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  undefined1 (*pauVar22) [32];
  undefined1 (*pauVar23) [32];
  float *pfVar24;
  ulong uVar25;
  int iVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  _func_int *p_Var34;
  float *pfVar35;
  uint uVar36;
  uint uVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  float *pfVar41;
  __m128 x64;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar87 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 in_ZMM5 [64];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  float fVar144;
  float fVar152;
  float fVar153;
  float fVar154;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  undefined1 auVar151 [64];
  float fVar169;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [64];
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  undefined1 auVar170 [32];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar182 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [64];
  _func_int *local_80;
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar187 [32];
  
  auVar18 = _DAT_005654a0;
  auVar17 = _DAT_00565480;
  iVar26 = bottom_top_blob->dims;
  pp_Var2 = this->_vptr_GroupNorm_x86_avx;
  local_80 = pp_Var2[-3];
  p_Var34 = (_func_int *)((long)&this->_vptr_GroupNorm_x86_avx + (long)local_80);
  iVar1 = *(int *)(&this->field_0xd0 + (long)local_80);
  uVar31 = (long)*(int *)(&this->field_0xd4 + (long)local_80) / (long)iVar1;
  uVar30 = uVar31 & 0xffffffff;
  uVar20 = (uint)uVar31;
  auVar96 = in_ZMM5._0_16_;
  if (iVar26 == 2) {
    if (0 < iVar1) {
      uVar21 = bottom_top_blob->w;
      uVar37 = uVar21 * uVar20;
      uVar27 = uVar37 & 0xfffffff8;
      lVar38 = 0;
      auVar94._8_8_ = 0x8000000000000000;
      auVar94._0_8_ = 0x8000000000000000;
      auVar96 = vpcmpeqd_avx(auVar96,auVar96);
      do {
        lVar40 = lVar38 * (int)uVar20;
        pauVar22 = (undefined1 (*) [32])
                   (bottom_top_blob->w * lVar40 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        fVar153 = 0.0;
        fVar154 = 0.0;
        fVar144 = 0.0;
        fVar152 = 0.0;
        fVar155 = 0.0;
        fVar156 = 0.0;
        fVar157 = 0.0;
        fVar158 = 0.0;
        pauVar23 = pauVar22;
        uVar29 = 0;
        fVar171 = 0.0;
        fVar172 = 0.0;
        fVar173 = 0.0;
        fVar174 = 0.0;
        fVar175 = 0.0;
        fVar176 = 0.0;
        fVar177 = 0.0;
        fVar169 = 0.0;
        if (7 < (int)uVar37) {
          iVar26 = 7;
          do {
            fVar144 = fVar144 + *(float *)*pauVar23;
            fVar152 = fVar152 + *(float *)(*pauVar23 + 4);
            fVar153 = fVar153 + *(float *)(*pauVar23 + 8);
            fVar154 = fVar154 + *(float *)(*pauVar23 + 0xc);
            fVar155 = fVar155 + *(float *)(*pauVar23 + 0x10);
            fVar156 = fVar156 + *(float *)(*pauVar23 + 0x14);
            fVar157 = fVar157 + *(float *)(*pauVar23 + 0x18);
            fVar158 = fVar158 + *(float *)(*pauVar23 + 0x1c);
            pauVar23 = pauVar23 + 1;
            iVar26 = iVar26 + 8;
            uVar29 = uVar27;
            fVar171 = fVar144;
            fVar172 = fVar152;
            fVar173 = fVar153;
            fVar174 = fVar154;
            fVar175 = fVar155;
            fVar176 = fVar156;
            fVar177 = fVar157;
            fVar169 = fVar158;
          } while (iVar26 < (int)uVar37);
        }
        uVar28 = uVar29 | 3;
        auVar80 = ZEXT816(0) << 0x40;
        while( true ) {
          fVar153 = auVar80._4_4_;
          fVar154 = auVar80._8_4_;
          fVar144 = auVar80._12_4_;
          if ((int)uVar37 <= (int)uVar28) break;
          auVar80._0_4_ = auVar80._0_4_ + *(float *)*pauVar23;
          auVar80._4_4_ = fVar153 + *(float *)(*pauVar23 + 4);
          auVar80._8_4_ = fVar154 + *(float *)(*pauVar23 + 8);
          auVar80._12_4_ = fVar144 + *(float *)(*pauVar23 + 0xc);
          pauVar23 = (undefined1 (*) [32])(*pauVar23 + 0x10);
          uVar28 = uVar29 + 7;
          uVar29 = uVar29 + 4;
        }
        auVar106._0_4_ = fVar171 + fVar175;
        auVar106._4_4_ = fVar172 + fVar176;
        auVar106._8_4_ = fVar173 + fVar177;
        auVar106._12_4_ = fVar174 + fVar169;
        auVar82 = vshufpd_avx(auVar106,auVar106,1);
        auVar107._0_4_ = auVar82._0_4_ + auVar106._0_4_;
        auVar107._4_4_ = auVar82._4_4_ + auVar106._4_4_;
        auVar107._8_4_ = auVar82._8_4_ + auVar106._8_4_;
        auVar107._12_4_ = auVar82._12_4_ + auVar106._12_4_;
        auVar82 = vshufpd_avx(auVar80,auVar80,1);
        auVar81._0_4_ = auVar82._0_4_ + auVar80._0_4_;
        auVar81._4_4_ = auVar82._4_4_ + fVar153;
        auVar81._8_4_ = auVar82._8_4_ + fVar154;
        auVar81._12_4_ = auVar82._12_4_ + fVar144;
        auVar80 = vhaddps_avx(auVar107,auVar107);
        auVar82 = vmovshdup_avx(auVar81);
        fVar153 = auVar80._0_4_ + auVar82._0_4_ + auVar81._0_4_;
        if ((int)uVar29 < (int)uVar37) {
          uVar31 = CONCAT44(0,~uVar29 + uVar37);
          auVar80 = vblendps_avx(ZEXT416((uint)fVar153),_DAT_00564cb0,0xe);
          auVar82._8_8_ = 0;
          auVar82._0_8_ = uVar31;
          auVar106 = vpshufd_avx(auVar82,0x44);
          auVar82 = vorps_avx(auVar106,auVar94);
          auVar81 = vorps_avx(auVar106,auVar94);
          uVar30 = 0;
          auVar195 = ZEXT1664(auVar80);
          do {
            auVar151 = auVar195;
            auVar83._8_8_ = 0;
            auVar83._0_8_ = uVar30;
            auVar80 = vpshufd_avx(auVar83,0x44);
            auVar89._16_16_ = auVar80;
            auVar89._0_16_ = auVar80;
            auVar119 = vorps_avx(auVar89,auVar17);
            auVar89 = vorps_avx(auVar89,auVar18);
            auVar80 = vorps_avx(auVar106,auVar94);
            auVar108._8_4_ = auVar89._24_4_;
            auVar108._0_8_ = auVar89._16_8_ ^ 0x8000000000000000;
            auVar108._12_4_ = auVar89._28_4_ ^ 0x80000000;
            auVar83 = vpcmpgtq_avx(auVar108,auVar80);
            auVar84._8_4_ = auVar89._8_4_;
            auVar137._8_4_ = auVar84._8_4_;
            auVar137._0_8_ = auVar89._0_8_ ^ 0x8000000000000000;
            auVar137._12_4_ = auVar89._12_4_ ^ 0x80000000;
            auVar107 = vpcmpgtq_avx(auVar137,auVar82);
            auVar107 = vpackssdw_avx(auVar107,auVar83);
            auVar190._0_8_ = auVar119._16_8_ ^ 0x8000000000000000;
            auVar190._8_4_ = auVar119._24_4_;
            auVar190._12_4_ = auVar119._28_4_ ^ 0x80000000;
            auVar108 = vpcmpgtq_avx(auVar190,auVar80);
            auVar191._0_8_ = auVar119._0_8_ ^ 0x8000000000000000;
            auVar191._8_4_ = auVar119._8_4_;
            auVar191._12_4_ = auVar119._12_4_ ^ 0x80000000;
            auVar80 = vpcmpgtq_avx(auVar191,auVar81);
            auVar80 = vpackssdw_avx(auVar80,auVar108);
            auVar80 = vpackssdw_avx(auVar80 ^ auVar96,auVar107 ^ auVar96);
            auVar107 = vpmovsxwd_avx(auVar80);
            auVar80 = vpunpckhwd_avx(auVar80,auVar80);
            auVar143._16_16_ = auVar80;
            auVar143._0_16_ = auVar107;
            auVar143 = vmaskmovps_avx(auVar143,*(undefined1 (*) [32])(*pauVar23 + uVar30 * 4));
            auVar146._0_4_ = auVar143._0_4_ + auVar151._0_4_;
            auVar146._4_4_ = auVar143._4_4_ + auVar151._4_4_;
            auVar146._8_4_ = auVar143._8_4_ + auVar151._8_4_;
            auVar146._12_4_ = auVar143._12_4_ + auVar151._12_4_;
            auVar149._16_4_ = auVar143._16_4_ + auVar151._16_4_;
            auVar149._0_16_ = auVar146;
            auVar149._20_4_ = auVar143._20_4_ + auVar151._20_4_;
            auVar149._24_4_ = auVar143._24_4_ + auVar151._24_4_;
            auVar149._28_4_ = auVar143._28_4_ + auVar151._28_4_;
            uVar30 = uVar30 + 8;
            auVar195 = ZEXT3264(auVar149);
          } while ((uVar31 + 8 & 0x1fffffff8) != uVar30);
          auVar80 = vorps_avx(auVar106,auVar94);
          auVar84._0_8_ = auVar89._0_8_ ^ 0x8000000000000000;
          auVar84._12_4_ = auVar89._12_4_ ^ 0x80000000;
          auVar80 = vpcmpgtq_avx(auVar84,auVar80);
          auVar82 = vpackssdw_avx(auVar80,auVar83);
          auVar80 = vorps_avx(auVar106,auVar94);
          auVar162._0_8_ = auVar119._0_8_ ^ 0x8000000000000000;
          auVar162._8_4_ = auVar119._8_4_;
          auVar162._12_4_ = auVar119._12_4_ ^ 0x80000000;
          auVar80 = vpcmpgtq_avx(auVar162,auVar80);
          auVar80 = vpackssdw_avx(auVar80,auVar108);
          auVar80 = vblendvps_avx(auVar151._0_16_,auVar146,auVar80 ^ auVar96);
          auVar82 = vblendvps_avx(auVar151._16_16_,auVar149._16_16_,auVar82 ^ auVar96);
          auVar80 = vhaddps_avx(auVar82,auVar80);
          auVar80 = vhaddps_avx(auVar80,auVar80);
          auVar80 = vhaddps_avx(auVar80,auVar80);
          fVar153 = auVar80._0_4_;
        }
        fVar153 = (1.0 / (float)(int)uVar37) * fVar153;
        auVar80 = vshufps_avx(ZEXT416((uint)fVar153),ZEXT416((uint)fVar153),0);
        pauVar23 = pauVar22;
        if ((int)uVar37 < 8) {
          fVar154 = 0.0;
          fVar171 = 0.0;
          fVar172 = 0.0;
          fVar173 = 0.0;
          fVar174 = 0.0;
          fVar175 = 0.0;
          fVar176 = 0.0;
          fVar177 = 0.0;
          uVar29 = 0;
        }
        else {
          auVar119._16_16_ = auVar80;
          auVar119._0_16_ = auVar80;
          fVar154 = 0.0;
          fVar171 = 0.0;
          fVar172 = 0.0;
          fVar173 = 0.0;
          fVar174 = 0.0;
          fVar175 = 0.0;
          fVar176 = 0.0;
          fVar177 = 0.0;
          iVar26 = 7;
          do {
            auVar89 = vsubps_avx(*pauVar23,auVar119);
            fVar154 = fVar154 + auVar89._0_4_ * auVar89._0_4_;
            fVar171 = fVar171 + auVar89._4_4_ * auVar89._4_4_;
            fVar172 = fVar172 + auVar89._8_4_ * auVar89._8_4_;
            fVar173 = fVar173 + auVar89._12_4_ * auVar89._12_4_;
            fVar174 = fVar174 + auVar89._16_4_ * auVar89._16_4_;
            fVar175 = fVar175 + auVar89._20_4_ * auVar89._20_4_;
            fVar176 = fVar176 + auVar89._24_4_ * auVar89._24_4_;
            fVar177 = fVar177 + auVar89._28_4_;
            pauVar23 = pauVar23 + 1;
            iVar26 = iVar26 + 8;
            uVar29 = uVar27;
          } while (iVar26 < (int)uVar37);
        }
        uVar28 = uVar29 | 3;
        auVar179 = ZEXT816(0) << 0x40;
        while( true ) {
          fVar169 = auVar179._4_4_;
          fVar144 = auVar179._8_4_;
          fVar152 = auVar179._12_4_;
          if ((int)uVar37 <= (int)uVar28) break;
          auVar82 = vsubps_avx(*(undefined1 (*) [16])*pauVar23,auVar80);
          auVar179._0_4_ = auVar179._0_4_ + auVar82._0_4_ * auVar82._0_4_;
          auVar179._4_4_ = fVar169 + auVar82._4_4_ * auVar82._4_4_;
          auVar179._8_4_ = fVar144 + auVar82._8_4_ * auVar82._8_4_;
          auVar179._12_4_ = fVar152 + auVar82._12_4_ * auVar82._12_4_;
          pauVar23 = (undefined1 (*) [32])(*pauVar23 + 0x10);
          uVar28 = uVar29 + 7;
          uVar29 = uVar29 + 4;
        }
        auVar109._0_4_ = fVar154 + fVar174;
        auVar109._4_4_ = fVar171 + fVar175;
        auVar109._8_4_ = fVar172 + fVar176;
        auVar109._12_4_ = fVar173 + fVar177;
        auVar82 = vshufpd_avx(auVar109,auVar109,1);
        auVar110._0_4_ = auVar82._0_4_ + auVar109._0_4_;
        auVar110._4_4_ = auVar82._4_4_ + auVar109._4_4_;
        auVar110._8_4_ = auVar82._8_4_ + auVar109._8_4_;
        auVar110._12_4_ = auVar82._12_4_ + auVar109._12_4_;
        auVar82 = vshufpd_avx(auVar179,auVar179,1);
        auVar125._0_4_ = auVar179._0_4_ + auVar82._0_4_;
        auVar125._4_4_ = fVar169 + auVar82._4_4_;
        auVar125._8_4_ = fVar144 + auVar82._8_4_;
        auVar125._12_4_ = fVar152 + auVar82._12_4_;
        auVar82 = vhaddps_avx(auVar110,auVar110);
        auVar81 = vmovshdup_avx(auVar125);
        fVar154 = auVar81._0_4_ + auVar82._0_4_ + auVar125._0_4_;
        if ((int)uVar29 < (int)uVar37) {
          uVar30 = CONCAT44(0,~uVar29 + uVar37);
          auVar82 = vblendps_avx(ZEXT416((uint)fVar154),_DAT_00564cb0,0xe);
          auVar111._8_8_ = 0;
          auVar111._0_8_ = uVar30;
          auVar106 = vpshufd_avx(auVar111,0x44);
          auVar181._16_16_ = auVar80;
          auVar181._0_16_ = auVar80;
          auVar80 = vorps_avx(auVar106,auVar94);
          auVar81 = vorps_avx(auVar106,auVar94);
          uVar31 = 0;
          auVar195 = ZEXT1664(auVar82);
          do {
            auVar151 = auVar195;
            auVar112._8_8_ = 0;
            auVar112._0_8_ = uVar31;
            auVar82 = vpshufd_avx(auVar112,0x44);
            auVar120._16_16_ = auVar82;
            auVar120._0_16_ = auVar82;
            auVar119 = vorps_avx(auVar120,auVar17);
            auVar89 = vorps_avx(auVar120,auVar18);
            auVar82 = vorps_avx(auVar106,auVar94);
            auVar126._0_8_ = auVar89._16_8_ ^ 0x8000000000000000;
            auVar126._8_4_ = auVar89._24_4_;
            auVar126._12_4_ = auVar89._28_4_ ^ 0x80000000;
            auVar83 = vpcmpgtq_avx(auVar126,auVar82);
            auVar163._0_8_ = auVar89._0_8_ ^ 0x8000000000000000;
            auVar113._8_4_ = auVar89._8_4_;
            auVar163._8_4_ = auVar113._8_4_;
            auVar163._12_4_ = auVar89._12_4_ ^ 0x80000000;
            auVar107 = vpcmpgtq_avx(auVar163,auVar80);
            auVar107 = vpackssdw_avx(auVar107,auVar83);
            auVar47._0_8_ = auVar119._16_8_ ^ 0x8000000000000000;
            auVar47._8_4_ = auVar119._24_4_;
            auVar47._12_4_ = auVar119._28_4_ ^ 0x80000000;
            auVar108 = vpcmpgtq_avx(auVar47,auVar82);
            auVar48._0_8_ = auVar119._0_8_ ^ 0x8000000000000000;
            auVar48._8_4_ = auVar119._8_4_;
            auVar48._12_4_ = auVar119._12_4_ ^ 0x80000000;
            auVar82 = vpcmpgtq_avx(auVar48,auVar81);
            auVar82 = vpackssdw_avx(auVar82,auVar108);
            auVar82 = vpackssdw_avx(auVar82 ^ auVar96,auVar107 ^ auVar96);
            auVar107 = vpmovsxwd_avx(auVar82);
            auVar82 = vpunpckhwd_avx(auVar82,auVar82);
            auVar68._16_16_ = auVar82;
            auVar68._0_16_ = auVar107;
            auVar143 = vmaskmovps_avx(auVar68,*(undefined1 (*) [32])(*pauVar23 + uVar31 * 4));
            auVar143 = vsubps_avx(auVar143,auVar181);
            auVar164._0_4_ = auVar143._0_4_ * auVar143._0_4_ + auVar151._0_4_;
            auVar164._4_4_ = auVar143._4_4_ * auVar143._4_4_ + auVar151._4_4_;
            auVar164._8_4_ = auVar143._8_4_ * auVar143._8_4_ + auVar151._8_4_;
            auVar164._12_4_ = auVar143._12_4_ * auVar143._12_4_ + auVar151._12_4_;
            auVar166._16_4_ = auVar143._16_4_ * auVar143._16_4_ + auVar151._16_4_;
            auVar166._0_16_ = auVar164;
            auVar166._20_4_ = auVar143._20_4_ * auVar143._20_4_ + auVar151._20_4_;
            auVar166._24_4_ = auVar143._24_4_ * auVar143._24_4_ + auVar151._24_4_;
            auVar166._28_4_ = auVar143._28_4_ + auVar151._28_4_;
            uVar31 = uVar31 + 8;
            auVar195 = ZEXT3264(auVar166);
          } while ((uVar30 + 8 & 0x1fffffff8) != uVar31);
          auVar80 = vorps_avx(auVar106,auVar94);
          auVar113._0_8_ = auVar89._0_8_ ^ 0x8000000000000000;
          auVar113._12_4_ = auVar89._12_4_ ^ 0x80000000;
          auVar80 = vpcmpgtq_avx(auVar113,auVar80);
          auVar82 = vpackssdw_avx(auVar80,auVar83);
          auVar80 = vorps_avx(auVar106,auVar94);
          auVar127._0_8_ = auVar119._0_8_ ^ 0x8000000000000000;
          auVar127._8_4_ = auVar119._8_4_;
          auVar127._12_4_ = auVar119._12_4_ ^ 0x80000000;
          auVar80 = vpcmpgtq_avx(auVar127,auVar80);
          auVar80 = vpackssdw_avx(auVar80,auVar108);
          auVar80 = vblendvps_avx(auVar151._0_16_,auVar164,auVar80 ^ auVar96);
          auVar82 = vblendvps_avx(auVar151._16_16_,auVar166._16_16_,auVar82 ^ auVar96);
          auVar80 = vhaddps_avx(auVar82,auVar80);
          auVar80 = vhaddps_avx(auVar80,auVar80);
          auVar80 = vhaddps_avx(auVar80,auVar80);
          fVar154 = auVar80._0_4_;
        }
        fVar154 = (1.0 / (float)(int)uVar37) * fVar154 + *(float *)(p_Var34 + 0xd8);
        auVar80 = vrsqrtss_avx(ZEXT416((uint)fVar154),ZEXT416((uint)fVar154));
        fVar171 = auVar80._0_4_;
        fVar154 = fVar171 * -0.5 * (fVar154 * fVar171 * fVar171 + -3.0);
        fVar171 = 0.0;
        fVar153 = fVar154 * -fVar153;
        if (*(int *)(p_Var34 + 0xdc) == 0) {
          auVar80 = vshufps_avx(ZEXT416((uint)fVar154),ZEXT416((uint)fVar154),0);
          auVar82 = vshufps_avx(ZEXT416((uint)fVar153),ZEXT416((uint)fVar153),0);
          fVar153 = auVar82._0_4_;
          fVar154 = auVar82._4_4_;
          fVar172 = auVar82._8_4_;
          fVar173 = auVar82._12_4_;
          fVar174 = auVar80._0_4_;
          fVar175 = auVar80._4_4_;
          fVar176 = auVar80._8_4_;
          fVar177 = auVar80._12_4_;
          uVar29 = 0;
          if (7 < (int)uVar37) {
            iVar26 = 7;
            do {
              fVar169 = *(float *)(*pauVar22 + 4);
              fVar144 = *(float *)(*pauVar22 + 8);
              fVar152 = *(float *)(*pauVar22 + 0xc);
              fVar155 = *(float *)(*pauVar22 + 0x10);
              fVar156 = *(float *)(*pauVar22 + 0x14);
              fVar157 = *(float *)(*pauVar22 + 0x18);
              fVar171 = fVar171 + fVar173;
              *(float *)*pauVar22 = fVar174 * *(float *)*pauVar22 + fVar153;
              *(float *)(*pauVar22 + 4) = fVar175 * fVar169 + fVar154;
              *(float *)(*pauVar22 + 8) = fVar176 * fVar144 + fVar172;
              *(float *)(*pauVar22 + 0xc) = fVar177 * fVar152 + fVar173;
              *(float *)(*pauVar22 + 0x10) = fVar174 * fVar155 + fVar153;
              *(float *)(*pauVar22 + 0x14) = fVar175 * fVar156 + fVar154;
              *(float *)(*pauVar22 + 0x18) = fVar176 * fVar157 + fVar172;
              *(float *)(*pauVar22 + 0x1c) = fVar171;
              pauVar22 = pauVar22 + 1;
              iVar26 = iVar26 + 8;
              uVar29 = uVar27;
            } while (iVar26 < (int)uVar37);
          }
          uVar28 = uVar29 | 3;
          while ((int)uVar28 < (int)uVar37) {
            fVar171 = *(float *)(*pauVar22 + 4);
            fVar169 = *(float *)(*pauVar22 + 8);
            fVar144 = *(float *)(*pauVar22 + 0xc);
            *(float *)*pauVar22 = fVar153 + fVar174 * *(float *)*pauVar22;
            *(float *)(*pauVar22 + 4) = fVar154 + fVar175 * fVar171;
            *(float *)(*pauVar22 + 8) = fVar172 + fVar176 * fVar169;
            *(float *)(*pauVar22 + 0xc) = fVar173 + fVar177 * fVar144;
            pauVar22 = (undefined1 (*) [32])(*pauVar22 + 0x10);
            uVar28 = uVar29 + 7;
            uVar29 = uVar29 + 4;
          }
          if ((int)uVar29 < (int)uVar37) {
            uVar30 = CONCAT44(0,~uVar29 + uVar37);
            auVar49._8_8_ = 0;
            auVar49._0_8_ = uVar30;
            auVar81 = vpshufd_avx(auVar49,0x44);
            auVar80 = vorps_avx(auVar81,auVar94);
            auVar82 = vorps_avx(auVar81,auVar94);
            uVar31 = 0;
            do {
              auVar50._8_8_ = 0;
              auVar50._0_8_ = uVar31;
              auVar106 = vpshufd_avx(auVar50,0x44);
              auVar69._16_16_ = auVar106;
              auVar69._0_16_ = auVar106;
              auVar119 = vorps_avx(auVar69,auVar17);
              auVar89 = vorps_avx(auVar69,auVar18);
              auVar106 = vorps_avx(auVar81,auVar94);
              auVar138._0_8_ = auVar89._16_8_ ^ 0x8000000000000000;
              auVar138._8_4_ = auVar89._24_4_;
              auVar138._12_4_ = auVar89._28_4_ ^ 0x80000000;
              auVar107 = vpcmpgtq_avx(auVar138,auVar106);
              auVar51._0_8_ = auVar89._0_8_ ^ 0x8000000000000000;
              auVar51._8_4_ = auVar89._8_4_;
              auVar51._12_4_ = auVar89._12_4_ ^ 0x80000000;
              auVar83 = vpcmpgtq_avx(auVar51,auVar80);
              auVar107 = vpackssdw_avx(auVar83,auVar107);
              auVar139._0_8_ = auVar119._16_8_ ^ 0x8000000000000000;
              auVar139._8_4_ = auVar119._24_4_;
              auVar139._12_4_ = auVar119._28_4_ ^ 0x80000000;
              auVar106 = vpcmpgtq_avx(auVar139,auVar106);
              auVar114._0_8_ = auVar119._0_8_ ^ 0x8000000000000000;
              auVar114._8_4_ = auVar119._8_4_;
              auVar114._12_4_ = auVar119._12_4_ ^ 0x80000000;
              auVar83 = vpcmpgtq_avx(auVar114,auVar82);
              auVar106 = vpackssdw_avx(auVar83,auVar106);
              auVar106 = vpackssdw_avx(auVar106 ^ auVar96,auVar107 ^ auVar96);
              auVar107 = vpmovsxwd_avx(auVar106);
              auVar106 = vpunpckhwd_avx(auVar106,auVar106);
              auVar70._16_16_ = auVar106;
              auVar70._0_16_ = auVar107;
              auVar119 = vmaskmovps_avx(auVar70,*(undefined1 (*) [32])(*pauVar22 + uVar31 * 4));
              auVar121._0_4_ = fVar153 + fVar174 * auVar119._0_4_;
              auVar121._4_4_ = fVar154 + fVar175 * auVar119._4_4_;
              auVar121._8_4_ = fVar172 + fVar176 * auVar119._8_4_;
              auVar121._12_4_ = fVar173 + fVar177 * auVar119._12_4_;
              auVar121._16_4_ = fVar153 + fVar174 * auVar119._16_4_;
              auVar121._20_4_ = fVar154 + fVar175 * auVar119._20_4_;
              auVar121._24_4_ = fVar172 + fVar176 * auVar119._24_4_;
              auVar121._28_4_ = fVar173 + auVar119._28_4_;
              auVar119 = vmaskmovps_avx(auVar70,auVar121);
              *(undefined1 (*) [32])(*pauVar22 + uVar31 * 4) = auVar119;
              uVar31 = uVar31 + 8;
            } while ((uVar30 + 8 & 0x1fffffff8) != uVar31);
          }
        }
        else if (0 < (int)uVar20) {
          pfVar24 = (float *)(*(long *)(p_Var34 + 0xf0) * lVar40 + *(long *)(p_Var34 + 0xe0));
          pfVar41 = (float *)(lVar40 * *(long *)(p_Var34 + 0x138) + *(long *)(p_Var34 + 0x128));
          uVar29 = 0;
          do {
            fVar173 = 0.0;
            fVar171 = fVar153 * *pfVar24 + *pfVar41;
            fVar172 = fVar154 * *pfVar24;
            auVar80 = vshufps_avx(ZEXT416((uint)fVar172),ZEXT416((uint)fVar172),0);
            auVar82 = vshufps_avx(ZEXT416((uint)fVar171),ZEXT416((uint)fVar171),0);
            fVar177 = auVar82._0_4_;
            fVar169 = auVar82._4_4_;
            fVar144 = auVar82._8_4_;
            fVar152 = auVar82._12_4_;
            fVar174 = auVar80._0_4_;
            fVar175 = auVar80._4_4_;
            fVar176 = auVar80._8_4_;
            if ((int)uVar21 < 8) {
              uVar28 = 0;
            }
            else {
              iVar26 = 7;
              do {
                fVar155 = *(float *)(*pauVar22 + 4);
                fVar156 = *(float *)(*pauVar22 + 8);
                fVar157 = *(float *)(*pauVar22 + 0xc);
                fVar158 = *(float *)(*pauVar22 + 0x10);
                fVar4 = *(float *)(*pauVar22 + 0x14);
                fVar5 = *(float *)(*pauVar22 + 0x18);
                fVar173 = fVar173 + fVar152;
                *(float *)*pauVar22 = fVar174 * *(float *)*pauVar22 + fVar177;
                *(float *)(*pauVar22 + 4) = fVar175 * fVar155 + fVar169;
                *(float *)(*pauVar22 + 8) = fVar176 * fVar156 + fVar144;
                *(float *)(*pauVar22 + 0xc) = auVar80._12_4_ * fVar157 + fVar152;
                *(float *)(*pauVar22 + 0x10) = fVar174 * fVar158 + fVar177;
                *(float *)(*pauVar22 + 0x14) = fVar175 * fVar4 + fVar169;
                *(float *)(*pauVar22 + 0x18) = fVar176 * fVar5 + fVar144;
                *(float *)(*pauVar22 + 0x1c) = fVar173;
                pauVar22 = pauVar22 + 1;
                iVar26 = iVar26 + 8;
                uVar28 = uVar21 & 0xfffffff8;
              } while (iVar26 < (int)uVar21);
            }
            uVar36 = uVar28 | 3;
            while ((int)uVar36 < (int)uVar21) {
              fVar173 = *(float *)(*pauVar22 + 4);
              fVar155 = *(float *)(*pauVar22 + 8);
              fVar156 = *(float *)(*pauVar22 + 0xc);
              *(float *)*pauVar22 = fVar177 + fVar174 * *(float *)*pauVar22;
              *(float *)(*pauVar22 + 4) = fVar169 + fVar175 * fVar173;
              *(float *)(*pauVar22 + 8) = fVar144 + fVar176 * fVar155;
              *(float *)(*pauVar22 + 0xc) = fVar152 + auVar80._12_4_ * fVar156;
              pauVar22 = (undefined1 (*) [32])(*pauVar22 + 0x10);
              uVar36 = uVar28 + 7;
              uVar28 = uVar28 + 4;
            }
            iVar26 = uVar21 - uVar28;
            if (iVar26 != 0 && (int)uVar28 <= (int)uVar21) {
              do {
                *(float *)*pauVar22 = fVar171 + fVar172 * *(float *)*pauVar22;
                pauVar22 = (undefined1 (*) [32])(*pauVar22 + 4);
                iVar26 = iVar26 + -1;
              } while (iVar26 != 0);
            }
            pfVar24 = pfVar24 + 1;
            pfVar41 = pfVar41 + 1;
            uVar29 = uVar29 + 1;
          } while (uVar29 != uVar20);
        }
        lVar38 = lVar38 + 1;
        p_Var34 = (_func_int *)((long)&this->_vptr_GroupNorm_x86_avx + (long)pp_Var2[-3]);
      } while (lVar38 < *(int *)(&this->field_0xd0 + (long)pp_Var2[-3]));
    }
  }
  else if (iVar26 == 1) {
    if (0 < iVar1) {
      uVar21 = uVar20 & 0xfffffff8;
      lVar38 = 0;
      auVar93._8_8_ = 0x8000000000000000;
      auVar93._0_8_ = 0x8000000000000000;
      auVar96 = vpcmpeqd_avx(auVar96,auVar96);
      do {
        lVar40 = lVar38 * (int)uVar20;
        pauVar22 = (undefined1 (*) [32])
                   (bottom_top_blob->elemsize * lVar40 + (long)bottom_top_blob->data);
        fVar153 = 0.0;
        fVar154 = 0.0;
        fVar144 = 0.0;
        fVar152 = 0.0;
        fVar155 = 0.0;
        fVar156 = 0.0;
        fVar157 = 0.0;
        fVar158 = 0.0;
        pauVar23 = pauVar22;
        uVar37 = 0;
        fVar171 = 0.0;
        fVar172 = 0.0;
        fVar173 = 0.0;
        fVar174 = 0.0;
        fVar175 = 0.0;
        fVar176 = 0.0;
        fVar177 = 0.0;
        fVar169 = 0.0;
        if (7 < (int)uVar20) {
          iVar26 = 7;
          do {
            fVar144 = fVar144 + *(float *)*pauVar23;
            fVar152 = fVar152 + *(float *)(*pauVar23 + 4);
            fVar153 = fVar153 + *(float *)(*pauVar23 + 8);
            fVar154 = fVar154 + *(float *)(*pauVar23 + 0xc);
            fVar155 = fVar155 + *(float *)(*pauVar23 + 0x10);
            fVar156 = fVar156 + *(float *)(*pauVar23 + 0x14);
            fVar157 = fVar157 + *(float *)(*pauVar23 + 0x18);
            fVar158 = fVar158 + *(float *)(*pauVar23 + 0x1c);
            pauVar23 = pauVar23 + 1;
            iVar26 = iVar26 + 8;
            uVar37 = uVar21;
            fVar171 = fVar144;
            fVar172 = fVar152;
            fVar173 = fVar153;
            fVar174 = fVar154;
            fVar175 = fVar155;
            fVar176 = fVar156;
            fVar177 = fVar157;
            fVar169 = fVar158;
          } while (iVar26 < (int)uVar20);
        }
        uVar27 = uVar37 | 3;
        auVar75 = ZEXT816(0) << 0x40;
        while( true ) {
          fVar153 = auVar75._4_4_;
          fVar154 = auVar75._8_4_;
          fVar144 = auVar75._12_4_;
          if ((int)uVar20 <= (int)uVar27) break;
          auVar75._0_4_ = auVar75._0_4_ + *(float *)*pauVar23;
          auVar75._4_4_ = fVar153 + *(float *)(*pauVar23 + 4);
          auVar75._8_4_ = fVar154 + *(float *)(*pauVar23 + 8);
          auVar75._12_4_ = fVar144 + *(float *)(*pauVar23 + 0xc);
          pauVar23 = (undefined1 (*) [32])(*pauVar23 + 0x10);
          uVar27 = uVar37 + 7;
          uVar37 = uVar37 + 4;
        }
        auVar97._0_4_ = fVar171 + fVar175;
        auVar97._4_4_ = fVar172 + fVar176;
        auVar97._8_4_ = fVar173 + fVar177;
        auVar97._12_4_ = fVar174 + fVar169;
        auVar94 = vshufpd_avx(auVar97,auVar97,1);
        auVar98._0_4_ = auVar94._0_4_ + auVar97._0_4_;
        auVar98._4_4_ = auVar94._4_4_ + auVar97._4_4_;
        auVar98._8_4_ = auVar94._8_4_ + auVar97._8_4_;
        auVar98._12_4_ = auVar94._12_4_ + auVar97._12_4_;
        auVar94 = vshufpd_avx(auVar75,auVar75,1);
        auVar76._0_4_ = auVar94._0_4_ + auVar75._0_4_;
        auVar76._4_4_ = auVar94._4_4_ + fVar153;
        auVar76._8_4_ = auVar94._8_4_ + fVar154;
        auVar76._12_4_ = auVar94._12_4_ + fVar144;
        auVar94 = vhaddps_avx(auVar98,auVar98);
        auVar80 = vmovshdup_avx(auVar76);
        fVar153 = auVar94._0_4_ + auVar80._0_4_ + auVar76._0_4_;
        if ((int)uVar37 < (int)uVar20) {
          uVar31 = CONCAT44(0,~uVar37 + uVar20);
          auVar94 = vblendps_avx(ZEXT416((uint)fVar153),_DAT_00564cb0,0xe);
          auVar77._8_8_ = 0;
          auVar77._0_8_ = uVar31;
          auVar81 = vpshufd_avx(auVar77,0x44);
          auVar80 = vorps_avx(auVar81,auVar93);
          auVar82 = vorps_avx(auVar81,auVar93);
          uVar30 = 0;
          auVar195 = ZEXT1664(auVar94);
          do {
            auVar151 = auVar195;
            auVar78._8_8_ = 0;
            auVar78._0_8_ = uVar30;
            auVar94 = vpshufd_avx(auVar78,0x44);
            auVar88._16_16_ = auVar94;
            auVar88._0_16_ = auVar94;
            auVar119 = vorps_avx(auVar88,auVar17);
            auVar89 = vorps_avx(auVar88,auVar18);
            auVar94 = vorps_avx(auVar81,auVar93);
            auVar99._8_4_ = auVar89._24_4_;
            auVar99._0_8_ = auVar89._16_8_ ^ 0x8000000000000000;
            auVar99._12_4_ = auVar89._28_4_ ^ 0x80000000;
            auVar107 = vpcmpgtq_avx(auVar99,auVar94);
            auVar79._8_4_ = auVar89._8_4_;
            auVar134._8_4_ = auVar79._8_4_;
            auVar134._0_8_ = auVar89._0_8_ ^ 0x8000000000000000;
            auVar134._12_4_ = auVar89._12_4_ ^ 0x80000000;
            auVar106 = vpcmpgtq_avx(auVar134,auVar80);
            auVar106 = vpackssdw_avx(auVar106,auVar107);
            auVar188._0_8_ = auVar119._16_8_ ^ 0x8000000000000000;
            auVar188._8_4_ = auVar119._24_4_;
            auVar188._12_4_ = auVar119._28_4_ ^ 0x80000000;
            auVar83 = vpcmpgtq_avx(auVar188,auVar94);
            auVar189._0_8_ = auVar119._0_8_ ^ 0x8000000000000000;
            auVar189._8_4_ = auVar119._8_4_;
            auVar189._12_4_ = auVar119._12_4_ ^ 0x80000000;
            auVar94 = vpcmpgtq_avx(auVar189,auVar82);
            auVar94 = vpackssdw_avx(auVar94,auVar83);
            auVar94 = vpackssdw_avx(auVar94 ^ auVar96,auVar106 ^ auVar96);
            auVar106 = vpmovsxwd_avx(auVar94);
            auVar94 = vpunpckhwd_avx(auVar94,auVar94);
            auVar142._16_16_ = auVar94;
            auVar142._0_16_ = auVar106;
            auVar143 = vmaskmovps_avx(auVar142,*(undefined1 (*) [32])(*pauVar23 + uVar30 * 4));
            auVar145._0_4_ = auVar143._0_4_ + auVar151._0_4_;
            auVar145._4_4_ = auVar143._4_4_ + auVar151._4_4_;
            auVar145._8_4_ = auVar143._8_4_ + auVar151._8_4_;
            auVar145._12_4_ = auVar143._12_4_ + auVar151._12_4_;
            auVar148._16_4_ = auVar143._16_4_ + auVar151._16_4_;
            auVar148._0_16_ = auVar145;
            auVar148._20_4_ = auVar143._20_4_ + auVar151._20_4_;
            auVar148._24_4_ = auVar143._24_4_ + auVar151._24_4_;
            auVar148._28_4_ = auVar143._28_4_ + auVar151._28_4_;
            uVar30 = uVar30 + 8;
            auVar195 = ZEXT3264(auVar148);
          } while ((uVar31 + 8 & 0x1fffffff8) != uVar30);
          auVar94 = vorps_avx(auVar81,auVar93);
          auVar79._0_8_ = auVar89._0_8_ ^ 0x8000000000000000;
          auVar79._12_4_ = auVar89._12_4_ ^ 0x80000000;
          auVar94 = vpcmpgtq_avx(auVar79,auVar94);
          auVar80 = vpackssdw_avx(auVar94,auVar107);
          auVar94 = vorps_avx(auVar81,auVar93);
          auVar159._0_8_ = auVar119._0_8_ ^ 0x8000000000000000;
          auVar159._8_4_ = auVar119._8_4_;
          auVar159._12_4_ = auVar119._12_4_ ^ 0x80000000;
          auVar94 = vpcmpgtq_avx(auVar159,auVar94);
          auVar94 = vpackssdw_avx(auVar94,auVar83);
          auVar94 = vblendvps_avx(auVar151._0_16_,auVar145,auVar94 ^ auVar96);
          auVar80 = vblendvps_avx(auVar151._16_16_,auVar148._16_16_,auVar80 ^ auVar96);
          auVar94 = vhaddps_avx(auVar80,auVar94);
          auVar94 = vhaddps_avx(auVar94,auVar94);
          auVar94 = vhaddps_avx(auVar94,auVar94);
          fVar153 = auVar94._0_4_;
        }
        fVar153 = (1.0 / (float)(int)uVar20) * fVar153;
        auVar94 = vshufps_avx(ZEXT416((uint)fVar153),ZEXT416((uint)fVar153),0);
        pauVar23 = pauVar22;
        if ((int)uVar20 < 8) {
          fVar154 = 0.0;
          fVar171 = 0.0;
          fVar172 = 0.0;
          fVar173 = 0.0;
          fVar174 = 0.0;
          fVar175 = 0.0;
          fVar176 = 0.0;
          fVar177 = 0.0;
          uVar37 = 0;
        }
        else {
          auVar116._16_16_ = auVar94;
          auVar116._0_16_ = auVar94;
          fVar154 = 0.0;
          fVar171 = 0.0;
          fVar172 = 0.0;
          fVar173 = 0.0;
          fVar174 = 0.0;
          fVar175 = 0.0;
          fVar176 = 0.0;
          fVar177 = 0.0;
          iVar26 = 7;
          do {
            auVar119 = vsubps_avx(*pauVar23,auVar116);
            fVar154 = fVar154 + auVar119._0_4_ * auVar119._0_4_;
            fVar171 = fVar171 + auVar119._4_4_ * auVar119._4_4_;
            fVar172 = fVar172 + auVar119._8_4_ * auVar119._8_4_;
            fVar173 = fVar173 + auVar119._12_4_ * auVar119._12_4_;
            fVar174 = fVar174 + auVar119._16_4_ * auVar119._16_4_;
            fVar175 = fVar175 + auVar119._20_4_ * auVar119._20_4_;
            fVar176 = fVar176 + auVar119._24_4_ * auVar119._24_4_;
            fVar177 = fVar177 + auVar119._28_4_;
            pauVar23 = pauVar23 + 1;
            iVar26 = iVar26 + 8;
            uVar37 = uVar21;
          } while (iVar26 < (int)uVar20);
        }
        uVar27 = uVar37 | 3;
        auVar178 = ZEXT816(0) << 0x40;
        while( true ) {
          fVar169 = auVar178._4_4_;
          fVar144 = auVar178._8_4_;
          fVar152 = auVar178._12_4_;
          if ((int)uVar20 <= (int)uVar27) break;
          auVar80 = vsubps_avx(*(undefined1 (*) [16])*pauVar23,auVar94);
          auVar178._0_4_ = auVar178._0_4_ + auVar80._0_4_ * auVar80._0_4_;
          auVar178._4_4_ = fVar169 + auVar80._4_4_ * auVar80._4_4_;
          auVar178._8_4_ = fVar144 + auVar80._8_4_ * auVar80._8_4_;
          auVar178._12_4_ = fVar152 + auVar80._12_4_ * auVar80._12_4_;
          pauVar23 = (undefined1 (*) [32])(*pauVar23 + 0x10);
          uVar27 = uVar37 + 7;
          uVar37 = uVar37 + 4;
        }
        auVar100._0_4_ = fVar154 + fVar174;
        auVar100._4_4_ = fVar171 + fVar175;
        auVar100._8_4_ = fVar172 + fVar176;
        auVar100._12_4_ = fVar173 + fVar177;
        auVar80 = vshufpd_avx(auVar100,auVar100,1);
        auVar101._0_4_ = auVar80._0_4_ + auVar100._0_4_;
        auVar101._4_4_ = auVar80._4_4_ + auVar100._4_4_;
        auVar101._8_4_ = auVar80._8_4_ + auVar100._8_4_;
        auVar101._12_4_ = auVar80._12_4_ + auVar100._12_4_;
        auVar80 = vshufpd_avx(auVar178,auVar178,1);
        auVar122._0_4_ = auVar178._0_4_ + auVar80._0_4_;
        auVar122._4_4_ = fVar169 + auVar80._4_4_;
        auVar122._8_4_ = fVar144 + auVar80._8_4_;
        auVar122._12_4_ = fVar152 + auVar80._12_4_;
        auVar80 = vhaddps_avx(auVar101,auVar101);
        auVar82 = vmovshdup_avx(auVar122);
        fVar154 = auVar82._0_4_ + auVar80._0_4_ + auVar122._0_4_;
        if ((int)uVar37 < (int)uVar20) {
          uVar30 = CONCAT44(0,~uVar37 + uVar20);
          auVar80 = vblendps_avx(ZEXT416((uint)fVar154),_DAT_00564cb0,0xe);
          auVar102._8_8_ = 0;
          auVar102._0_8_ = uVar30;
          auVar81 = vpshufd_avx(auVar102,0x44);
          auVar180._16_16_ = auVar94;
          auVar180._0_16_ = auVar94;
          auVar94 = vorps_avx(auVar81,auVar93);
          auVar82 = vorps_avx(auVar81,auVar93);
          uVar31 = 0;
          auVar195 = ZEXT1664(auVar80);
          do {
            auVar151 = auVar195;
            auVar103._8_8_ = 0;
            auVar103._0_8_ = uVar31;
            auVar80 = vpshufd_avx(auVar103,0x44);
            auVar117._16_16_ = auVar80;
            auVar117._0_16_ = auVar80;
            auVar119 = vorps_avx(auVar117,auVar17);
            auVar89 = vorps_avx(auVar117,auVar18);
            auVar80 = vorps_avx(auVar81,auVar93);
            auVar123._0_8_ = auVar89._16_8_ ^ 0x8000000000000000;
            auVar123._8_4_ = auVar89._24_4_;
            auVar123._12_4_ = auVar89._28_4_ ^ 0x80000000;
            auVar107 = vpcmpgtq_avx(auVar123,auVar80);
            auVar160._0_8_ = auVar89._0_8_ ^ 0x8000000000000000;
            auVar104._8_4_ = auVar89._8_4_;
            auVar160._8_4_ = auVar104._8_4_;
            auVar160._12_4_ = auVar89._12_4_ ^ 0x80000000;
            auVar106 = vpcmpgtq_avx(auVar160,auVar94);
            auVar106 = vpackssdw_avx(auVar106,auVar107);
            auVar42._0_8_ = auVar119._16_8_ ^ 0x8000000000000000;
            auVar42._8_4_ = auVar119._24_4_;
            auVar42._12_4_ = auVar119._28_4_ ^ 0x80000000;
            auVar83 = vpcmpgtq_avx(auVar42,auVar80);
            auVar43._0_8_ = auVar119._0_8_ ^ 0x8000000000000000;
            auVar43._8_4_ = auVar119._8_4_;
            auVar43._12_4_ = auVar119._12_4_ ^ 0x80000000;
            auVar80 = vpcmpgtq_avx(auVar43,auVar82);
            auVar80 = vpackssdw_avx(auVar80,auVar83);
            auVar80 = vpackssdw_avx(auVar80 ^ auVar96,auVar106 ^ auVar96);
            auVar106 = vpmovsxwd_avx(auVar80);
            auVar80 = vpunpckhwd_avx(auVar80,auVar80);
            auVar65._16_16_ = auVar80;
            auVar65._0_16_ = auVar106;
            auVar143 = vmaskmovps_avx(auVar65,*(undefined1 (*) [32])(*pauVar23 + uVar31 * 4));
            auVar143 = vsubps_avx(auVar143,auVar180);
            auVar161._0_4_ = auVar143._0_4_ * auVar143._0_4_ + auVar151._0_4_;
            auVar161._4_4_ = auVar143._4_4_ * auVar143._4_4_ + auVar151._4_4_;
            auVar161._8_4_ = auVar143._8_4_ * auVar143._8_4_ + auVar151._8_4_;
            auVar161._12_4_ = auVar143._12_4_ * auVar143._12_4_ + auVar151._12_4_;
            auVar165._16_4_ = auVar143._16_4_ * auVar143._16_4_ + auVar151._16_4_;
            auVar165._0_16_ = auVar161;
            auVar165._20_4_ = auVar143._20_4_ * auVar143._20_4_ + auVar151._20_4_;
            auVar165._24_4_ = auVar143._24_4_ * auVar143._24_4_ + auVar151._24_4_;
            auVar165._28_4_ = auVar143._28_4_ + auVar151._28_4_;
            uVar31 = uVar31 + 8;
            auVar195 = ZEXT3264(auVar165);
          } while ((uVar30 + 8 & 0x1fffffff8) != uVar31);
          auVar94 = vorps_avx(auVar81,auVar93);
          auVar104._0_8_ = auVar89._0_8_ ^ 0x8000000000000000;
          auVar104._12_4_ = auVar89._12_4_ ^ 0x80000000;
          auVar94 = vpcmpgtq_avx(auVar104,auVar94);
          auVar80 = vpackssdw_avx(auVar94,auVar107);
          auVar94 = vorps_avx(auVar81,auVar93);
          auVar124._0_8_ = auVar119._0_8_ ^ 0x8000000000000000;
          auVar124._8_4_ = auVar119._8_4_;
          auVar124._12_4_ = auVar119._12_4_ ^ 0x80000000;
          auVar94 = vpcmpgtq_avx(auVar124,auVar94);
          auVar94 = vpackssdw_avx(auVar94,auVar83);
          auVar94 = vblendvps_avx(auVar151._0_16_,auVar161,auVar94 ^ auVar96);
          auVar80 = vblendvps_avx(auVar151._16_16_,auVar165._16_16_,auVar80 ^ auVar96);
          auVar94 = vhaddps_avx(auVar80,auVar94);
          auVar94 = vhaddps_avx(auVar94,auVar94);
          auVar94 = vhaddps_avx(auVar94,auVar94);
          fVar154 = auVar94._0_4_;
        }
        fVar154 = (1.0 / (float)(int)uVar20) * fVar154 + *(float *)(p_Var34 + 0xd8);
        auVar94 = vrsqrtss_avx(ZEXT416((uint)fVar154),ZEXT416((uint)fVar154));
        fVar171 = auVar94._0_4_;
        fVar154 = fVar171 * -0.5 * (fVar154 * fVar171 * fVar171 + -3.0);
        fVar171 = 0.0;
        fVar153 = fVar154 * -fVar153;
        auVar94 = vshufps_avx(ZEXT416((uint)fVar154),ZEXT416((uint)fVar154),0);
        auVar80 = vshufps_avx(ZEXT416((uint)fVar153),ZEXT416((uint)fVar153),0);
        fVar172 = auVar94._0_4_;
        fVar173 = auVar94._4_4_;
        fVar174 = auVar94._8_4_;
        fVar175 = auVar94._12_4_;
        fVar176 = auVar80._0_4_;
        fVar177 = auVar80._4_4_;
        fVar169 = auVar80._8_4_;
        fVar144 = auVar80._12_4_;
        if (*(int *)(p_Var34 + 0xdc) == 0) {
          uVar37 = 0;
          if (7 < (int)uVar20) {
            iVar26 = 7;
            do {
              fVar153 = *(float *)(*pauVar22 + 4);
              fVar154 = *(float *)(*pauVar22 + 8);
              fVar152 = *(float *)(*pauVar22 + 0xc);
              fVar155 = *(float *)(*pauVar22 + 0x10);
              fVar156 = *(float *)(*pauVar22 + 0x14);
              fVar157 = *(float *)(*pauVar22 + 0x18);
              fVar171 = fVar144 + fVar171;
              *(float *)*pauVar22 = fVar176 + fVar172 * *(float *)*pauVar22;
              *(float *)(*pauVar22 + 4) = fVar177 + fVar173 * fVar153;
              *(float *)(*pauVar22 + 8) = fVar169 + fVar174 * fVar154;
              *(float *)(*pauVar22 + 0xc) = fVar144 + fVar175 * fVar152;
              *(float *)(*pauVar22 + 0x10) = fVar176 + fVar172 * fVar155;
              *(float *)(*pauVar22 + 0x14) = fVar177 + fVar173 * fVar156;
              *(float *)(*pauVar22 + 0x18) = fVar169 + fVar174 * fVar157;
              *(float *)(*pauVar22 + 0x1c) = fVar171;
              pauVar22 = pauVar22 + 1;
              iVar26 = iVar26 + 8;
              uVar37 = uVar21;
            } while (iVar26 < (int)uVar20);
          }
          uVar27 = uVar37 | 3;
          while ((int)uVar27 < (int)uVar20) {
            fVar153 = *(float *)(*pauVar22 + 4);
            fVar154 = *(float *)(*pauVar22 + 8);
            fVar171 = *(float *)(*pauVar22 + 0xc);
            *(float *)*pauVar22 = fVar176 + fVar172 * *(float *)*pauVar22;
            *(float *)(*pauVar22 + 4) = fVar177 + fVar173 * fVar153;
            *(float *)(*pauVar22 + 8) = fVar169 + fVar174 * fVar154;
            *(float *)(*pauVar22 + 0xc) = fVar144 + fVar175 * fVar171;
            pauVar22 = (undefined1 (*) [32])(*pauVar22 + 0x10);
            uVar27 = uVar37 + 7;
            uVar37 = uVar37 + 4;
          }
          if ((int)uVar37 < (int)uVar20) {
            uVar30 = CONCAT44(0,~uVar37 + uVar20);
            auVar44._8_8_ = 0;
            auVar44._0_8_ = uVar30;
            auVar82 = vpshufd_avx(auVar44,0x44);
            auVar94 = vorps_avx(auVar82,auVar93);
            auVar80 = vorps_avx(auVar82,auVar93);
            uVar31 = 0;
            do {
              auVar45._8_8_ = 0;
              auVar45._0_8_ = uVar31;
              auVar81 = vpshufd_avx(auVar45,0x44);
              auVar66._16_16_ = auVar81;
              auVar66._0_16_ = auVar81;
              auVar119 = vorps_avx(auVar66,auVar17);
              auVar89 = vorps_avx(auVar66,auVar18);
              auVar81 = vorps_avx(auVar82,auVar93);
              auVar135._0_8_ = auVar89._16_8_ ^ 0x8000000000000000;
              auVar135._8_4_ = auVar89._24_4_;
              auVar135._12_4_ = auVar89._28_4_ ^ 0x80000000;
              auVar106 = vpcmpgtq_avx(auVar135,auVar81);
              auVar46._0_8_ = auVar89._0_8_ ^ 0x8000000000000000;
              auVar46._8_4_ = auVar89._8_4_;
              auVar46._12_4_ = auVar89._12_4_ ^ 0x80000000;
              auVar107 = vpcmpgtq_avx(auVar46,auVar94);
              auVar106 = vpackssdw_avx(auVar107,auVar106);
              auVar136._0_8_ = auVar119._16_8_ ^ 0x8000000000000000;
              auVar136._8_4_ = auVar119._24_4_;
              auVar136._12_4_ = auVar119._28_4_ ^ 0x80000000;
              auVar81 = vpcmpgtq_avx(auVar136,auVar81);
              auVar105._0_8_ = auVar119._0_8_ ^ 0x8000000000000000;
              auVar105._8_4_ = auVar119._8_4_;
              auVar105._12_4_ = auVar119._12_4_ ^ 0x80000000;
              auVar107 = vpcmpgtq_avx(auVar105,auVar80);
              auVar81 = vpackssdw_avx(auVar107,auVar81);
              auVar81 = vpackssdw_avx(auVar81 ^ auVar96,auVar106 ^ auVar96);
              auVar106 = vpmovsxwd_avx(auVar81);
              auVar81 = vpunpckhwd_avx(auVar81,auVar81);
              auVar67._16_16_ = auVar81;
              auVar67._0_16_ = auVar106;
              auVar119 = vmaskmovps_avx(auVar67,*(undefined1 (*) [32])(*pauVar22 + uVar31 * 4));
              auVar118._0_4_ = fVar176 + fVar172 * auVar119._0_4_;
              auVar118._4_4_ = fVar177 + fVar173 * auVar119._4_4_;
              auVar118._8_4_ = fVar169 + fVar174 * auVar119._8_4_;
              auVar118._12_4_ = fVar144 + fVar175 * auVar119._12_4_;
              auVar118._16_4_ = fVar176 + fVar172 * auVar119._16_4_;
              auVar118._20_4_ = fVar177 + fVar173 * auVar119._20_4_;
              auVar118._24_4_ = fVar169 + fVar174 * auVar119._24_4_;
              auVar118._28_4_ = fVar144 + auVar119._28_4_;
              auVar119 = vmaskmovps_avx(auVar67,auVar118);
              *(undefined1 (*) [32])(*pauVar22 + uVar31 * 4) = auVar119;
              uVar31 = uVar31 + 8;
            } while ((uVar30 + 8 & 0x1fffffff8) != uVar31);
          }
        }
        else {
          pfVar24 = (float *)(*(long *)(p_Var34 + 0xf0) * lVar40 + *(long *)(p_Var34 + 0xe0));
          pfVar41 = (float *)(lVar40 * *(long *)(p_Var34 + 0x138) + *(long *)(p_Var34 + 0x128));
          uVar37 = 0;
          if (7 < (int)uVar20) {
            iVar26 = 7;
            do {
              fVar152 = *(float *)(*pauVar22 + 4);
              fVar155 = *(float *)(*pauVar22 + 8);
              fVar156 = *(float *)(*pauVar22 + 0xc);
              fVar157 = *(float *)(*pauVar22 + 0x10);
              fVar158 = *(float *)(*pauVar22 + 0x14);
              fVar4 = *(float *)(*pauVar22 + 0x18);
              fVar5 = pfVar24[1];
              fVar6 = pfVar24[2];
              fVar7 = pfVar24[3];
              fVar8 = pfVar24[4];
              fVar9 = pfVar24[5];
              fVar10 = pfVar24[6];
              fVar11 = pfVar41[1];
              fVar12 = pfVar41[2];
              fVar13 = pfVar41[3];
              fVar14 = pfVar41[4];
              fVar15 = pfVar41[5];
              fVar16 = pfVar41[6];
              fVar171 = fVar144 + fVar171 + pfVar41[7];
              *(float *)*pauVar22 = (fVar176 + fVar172 * *(float *)*pauVar22) * *pfVar24 + *pfVar41;
              *(float *)(*pauVar22 + 4) = (fVar177 + fVar173 * fVar152) * fVar5 + fVar11;
              *(float *)(*pauVar22 + 8) = (fVar169 + fVar174 * fVar155) * fVar6 + fVar12;
              *(float *)(*pauVar22 + 0xc) = (fVar144 + fVar175 * fVar156) * fVar7 + fVar13;
              *(float *)(*pauVar22 + 0x10) = (fVar176 + fVar172 * fVar157) * fVar8 + fVar14;
              *(float *)(*pauVar22 + 0x14) = (fVar177 + fVar173 * fVar158) * fVar9 + fVar15;
              *(float *)(*pauVar22 + 0x18) = (fVar169 + fVar174 * fVar4) * fVar10 + fVar16;
              *(float *)(*pauVar22 + 0x1c) = fVar171;
              pfVar24 = pfVar24 + 8;
              pfVar41 = pfVar41 + 8;
              pauVar22 = pauVar22 + 1;
              iVar26 = iVar26 + 8;
              uVar37 = uVar21;
            } while (iVar26 < (int)uVar20);
          }
          uVar27 = uVar37 | 3;
          while ((int)uVar27 < (int)uVar20) {
            fVar171 = *(float *)(*pauVar22 + 4);
            fVar152 = *(float *)(*pauVar22 + 8);
            fVar155 = *(float *)(*pauVar22 + 0xc);
            fVar156 = pfVar24[1];
            fVar157 = pfVar24[2];
            fVar158 = pfVar24[3];
            fVar4 = pfVar41[1];
            fVar5 = pfVar41[2];
            fVar6 = pfVar41[3];
            *(float *)*pauVar22 = (fVar176 + fVar172 * *(float *)*pauVar22) * *pfVar24 + *pfVar41;
            *(float *)(*pauVar22 + 4) = (fVar177 + fVar173 * fVar171) * fVar156 + fVar4;
            *(float *)(*pauVar22 + 8) = (fVar169 + fVar174 * fVar152) * fVar157 + fVar5;
            *(float *)(*pauVar22 + 0xc) = (fVar144 + fVar175 * fVar155) * fVar158 + fVar6;
            pfVar24 = pfVar24 + 4;
            pfVar41 = pfVar41 + 4;
            pauVar22 = (undefined1 (*) [32])(*pauVar22 + 0x10);
            uVar27 = uVar37 + 7;
            uVar37 = uVar37 + 4;
          }
          if ((int)uVar37 < (int)uVar20) {
            lVar40 = 0;
            do {
              *(float *)(*pauVar22 + lVar40 * 4) =
                   (fVar153 + fVar154 * *(float *)(*pauVar22 + lVar40 * 4)) * pfVar24[lVar40] +
                   pfVar41[lVar40];
              lVar40 = lVar40 + 1;
            } while (uVar20 - uVar37 != (int)lVar40);
          }
        }
        lVar38 = lVar38 + 1;
        p_Var34 = (_func_int *)((long)&this->_vptr_GroupNorm_x86_avx + (long)pp_Var2[-3]);
      } while (lVar38 < *(int *)(&this->field_0xd0 + (long)pp_Var2[-3]));
    }
  }
  else if ((iVar26 - 3U < 2) && (0 < iVar1)) {
    uVar37 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    uVar21 = uVar37 & 0xfffffff8;
    fVar153 = 1.0 / (float)(int)(uVar37 * uVar20);
    lVar38 = 0;
    auVar195 = ZEXT1264(ZEXT812(0));
    auVar95._8_8_ = 0x8000000000000000;
    auVar95._0_8_ = 0x8000000000000000;
    auVar96 = vpcmpeqd_avx(auVar96,auVar96);
    do {
      lVar39 = lVar38 * (int)uVar20;
      uVar31 = bottom_top_blob->elemsize;
      lVar40 = bottom_top_blob->cstep * lVar39 * uVar31;
      pvVar3 = bottom_top_blob->data;
      uVar19 = ((long)bottom_top_blob->d * uVar31 *
                (long)bottom_top_blob->h * (long)bottom_top_blob->w + 0xf & 0xfffffffffffffff0) /
               uVar31;
      pfVar24 = (float *)(*(long *)(p_Var34 + 0xf0) * lVar39 + *(long *)(p_Var34 + 0xe0));
      pfVar41 = (float *)(lVar39 * *(long *)(p_Var34 + 0x138) + *(long *)(p_Var34 + 0x128));
      if ((int)uVar20 < 1) {
        auVar151 = ZEXT1664(ZEXT816(0) << 0x40);
        fVar154 = 0.0;
      }
      else {
        lVar39 = uVar19 * uVar31;
        auVar151 = ZEXT1664(ZEXT816(0) << 0x40);
        uVar25 = 0;
        do {
          pfVar35 = (float *)((long)pvVar3 + lVar39 * uVar25 + lVar40);
          if ((int)uVar37 < 8) {
            auVar167 = SUB6432(ZEXT864(0),0);
            uVar27 = 0;
          }
          else {
            auVar168 = ZEXT864(0);
            iVar26 = 7;
            do {
              auVar167._0_4_ = auVar168._0_4_ + *pfVar35;
              auVar167._4_4_ = auVar168._4_4_ + pfVar35[1];
              auVar167._8_4_ = auVar168._8_4_ + pfVar35[2];
              auVar167._12_4_ = auVar168._12_4_ + pfVar35[3];
              auVar167._16_4_ = auVar168._16_4_ + pfVar35[4];
              auVar167._20_4_ = auVar168._20_4_ + pfVar35[5];
              auVar167._24_4_ = auVar168._24_4_ + pfVar35[6];
              auVar167._28_4_ = auVar168._28_4_ + pfVar35[7];
              auVar168 = ZEXT3264(auVar167);
              pfVar35 = pfVar35 + 8;
              iVar26 = iVar26 + 8;
              uVar27 = uVar21;
            } while (iVar26 < (int)uVar37);
          }
          uVar29 = uVar27 | 3;
          auVar140 = ZEXT816(0) << 0x40;
          while( true ) {
            fVar154 = auVar140._4_4_;
            fVar171 = auVar140._8_4_;
            fVar172 = auVar140._12_4_;
            if ((int)uVar37 <= (int)uVar29) break;
            auVar140._0_4_ = auVar140._0_4_ + *pfVar35;
            auVar140._4_4_ = fVar154 + pfVar35[1];
            auVar140._8_4_ = fVar171 + pfVar35[2];
            auVar140._12_4_ = fVar172 + pfVar35[3];
            pfVar35 = pfVar35 + 4;
            uVar29 = uVar27 + 7;
            uVar27 = uVar27 + 4;
          }
          auVar52._0_4_ = auVar167._0_4_ + auVar167._16_4_;
          auVar52._4_4_ = auVar167._4_4_ + auVar167._20_4_;
          auVar52._8_4_ = auVar167._8_4_ + auVar167._24_4_;
          auVar52._12_4_ = auVar167._12_4_ + auVar167._28_4_;
          auVar94 = vshufpd_avx(auVar52,auVar52,1);
          auVar53._0_4_ = auVar94._0_4_ + auVar52._0_4_;
          auVar53._4_4_ = auVar94._4_4_ + auVar52._4_4_;
          auVar53._8_4_ = auVar94._8_4_ + auVar52._8_4_;
          auVar53._12_4_ = auVar94._12_4_ + auVar52._12_4_;
          auVar94 = vmovshdup_avx(auVar53);
          auVar80 = vshufpd_avx(auVar140,auVar140,1);
          auVar128._0_4_ = auVar140._0_4_ + auVar80._0_4_;
          auVar128._4_4_ = fVar154 + auVar80._4_4_;
          auVar128._8_4_ = fVar171 + auVar80._8_4_;
          auVar128._12_4_ = fVar172 + auVar80._12_4_;
          auVar80 = vmovshdup_avx(auVar128);
          fVar154 = auVar80._0_4_ + auVar151._0_4_ + auVar94._0_4_ + auVar53._0_4_ + auVar128._0_4_;
          auVar151 = ZEXT464((uint)fVar154);
          if ((int)uVar27 < (int)uVar37) {
            uVar33 = CONCAT44(0,~uVar27 + uVar37);
            auVar54._8_8_ = 0;
            auVar54._0_8_ = uVar33;
            auVar82 = vpshufd_avx(auVar54,0x44);
            auVar94 = vorps_avx(auVar82,auVar95);
            auVar80 = vorps_avx(auVar82,auVar95);
            uVar32 = 0;
            auVar151 = ZEXT1664(CONCAT124(auVar195._4_12_,fVar154));
            do {
              auVar168 = auVar151;
              auVar55._8_8_ = 0;
              auVar55._0_8_ = uVar32;
              auVar81 = vpshufd_avx(auVar55,0x44);
              auVar71._16_16_ = auVar81;
              auVar71._0_16_ = auVar81;
              auVar119 = vorps_avx(auVar71,auVar17);
              auVar89 = vorps_avx(auVar71,auVar18);
              auVar81 = vorps_avx(auVar82,auVar95);
              auVar56._0_8_ = auVar89._16_8_ ^ 0x8000000000000000;
              auVar56._8_4_ = auVar89._24_4_;
              auVar56._12_4_ = auVar89._28_4_ ^ 0x80000000;
              auVar107 = vpcmpgtq_avx(auVar56,auVar81);
              auVar182._0_8_ = auVar89._0_8_ ^ 0x8000000000000000;
              auVar115._8_4_ = auVar89._8_4_;
              auVar182._8_4_ = auVar115._8_4_;
              auVar182._12_4_ = auVar89._12_4_ ^ 0x80000000;
              auVar106 = vpcmpgtq_avx(auVar182,auVar94);
              auVar106 = vpackssdw_avx(auVar106,auVar107);
              auVar192._0_8_ = auVar119._16_8_ ^ 0x8000000000000000;
              auVar192._8_4_ = auVar119._24_4_;
              auVar192._12_4_ = auVar119._28_4_ ^ 0x80000000;
              auVar83 = vpcmpgtq_avx(auVar192,auVar81);
              auVar193._0_8_ = auVar119._0_8_ ^ 0x8000000000000000;
              auVar193._8_4_ = auVar119._8_4_;
              auVar193._12_4_ = auVar119._12_4_ ^ 0x80000000;
              auVar81 = vpcmpgtq_avx(auVar193,auVar80);
              auVar81 = vpackssdw_avx(auVar81,auVar83);
              auVar81 = vpackssdw_avx(auVar81 ^ auVar96,auVar106 ^ auVar96);
              auVar106 = vpmovsxwd_avx(auVar81);
              auVar81 = vpunpckhwd_avx(auVar81,auVar81);
              auVar185._16_16_ = auVar81;
              auVar185._0_16_ = auVar106;
              auVar143 = vmaskmovps_avx(auVar185,*(undefined1 (*) [32])(pfVar35 + uVar32));
              auVar147._0_4_ = auVar143._0_4_ + auVar168._0_4_;
              auVar147._4_4_ = auVar143._4_4_ + auVar168._4_4_;
              auVar147._8_4_ = auVar143._8_4_ + auVar168._8_4_;
              auVar147._12_4_ = auVar143._12_4_ + auVar168._12_4_;
              auVar150._16_4_ = auVar143._16_4_ + auVar168._16_4_;
              auVar150._0_16_ = auVar147;
              auVar150._20_4_ = auVar143._20_4_ + auVar168._20_4_;
              auVar150._24_4_ = auVar143._24_4_ + auVar168._24_4_;
              auVar150._28_4_ = auVar143._28_4_ + auVar168._28_4_;
              uVar32 = uVar32 + 8;
              auVar151 = ZEXT3264(auVar150);
            } while ((uVar33 + 8 & 0x1fffffff8) != uVar32);
            auVar94 = vorps_avx(auVar82,auVar95);
            auVar115._0_8_ = auVar89._0_8_ ^ 0x8000000000000000;
            auVar115._12_4_ = auVar89._12_4_ ^ 0x80000000;
            auVar94 = vpcmpgtq_avx(auVar115,auVar94);
            auVar80 = vpackssdw_avx(auVar94,auVar107);
            auVar94 = vorps_avx(auVar82,auVar95);
            auVar141._0_8_ = auVar119._0_8_ ^ 0x8000000000000000;
            auVar141._8_4_ = auVar119._8_4_;
            auVar141._12_4_ = auVar119._12_4_ ^ 0x80000000;
            auVar94 = vpcmpgtq_avx(auVar141,auVar94);
            auVar94 = vpackssdw_avx(auVar94,auVar83);
            auVar94 = vblendvps_avx(auVar168._0_16_,auVar147,auVar94 ^ auVar96);
            auVar80 = vblendvps_avx(auVar168._16_16_,auVar150._16_16_,auVar80 ^ auVar96);
            auVar94 = vhaddps_avx(auVar80,auVar94);
            auVar94 = vhaddps_avx(auVar94,auVar94);
            auVar94 = vhaddps_avx(auVar94,auVar94);
            auVar151 = ZEXT1664(auVar94);
          }
          uVar25 = uVar25 + 1;
        } while (uVar25 != uVar30);
        fVar171 = auVar151._0_4_ * fVar153;
        auVar151 = ZEXT464((uint)fVar171);
        if ((int)uVar20 < 1) {
          fVar154 = 0.0;
        }
        else {
          auVar94 = vshufps_avx(ZEXT416((uint)fVar171),ZEXT416((uint)fVar171),0);
          auVar170._16_16_ = auVar94;
          auVar170._0_16_ = auVar94;
          auVar151 = ZEXT864(0);
          uVar25 = 0;
          do {
            pauVar22 = (undefined1 (*) [32])((long)pvVar3 + lVar39 * uVar25 + lVar40);
            if ((int)uVar37 < 8) {
              auVar186 = SUB6432(ZEXT864(0),0);
              uVar27 = 0;
            }
            else {
              auVar168 = ZEXT864(0);
              iVar26 = 7;
              do {
                auVar119 = vsubps_avx(*pauVar22,auVar170);
                auVar186._0_4_ = auVar168._0_4_ + auVar119._0_4_ * auVar119._0_4_;
                auVar186._4_4_ = auVar168._4_4_ + auVar119._4_4_ * auVar119._4_4_;
                auVar186._8_4_ = auVar168._8_4_ + auVar119._8_4_ * auVar119._8_4_;
                auVar186._12_4_ = auVar168._12_4_ + auVar119._12_4_ * auVar119._12_4_;
                auVar186._16_4_ = auVar168._16_4_ + auVar119._16_4_ * auVar119._16_4_;
                auVar186._20_4_ = auVar168._20_4_ + auVar119._20_4_ * auVar119._20_4_;
                auVar186._24_4_ = auVar168._24_4_ + auVar119._24_4_ * auVar119._24_4_;
                auVar186._28_4_ = auVar168._28_4_ + auVar119._28_4_;
                auVar168 = ZEXT3264(auVar186);
                pauVar22 = pauVar22 + 1;
                iVar26 = iVar26 + 8;
                uVar27 = uVar21;
              } while (iVar26 < (int)uVar37);
            }
            uVar29 = uVar27 | 3;
            auVar194 = ZEXT816(0) << 0x40;
            while( true ) {
              fVar154 = auVar194._4_4_;
              fVar172 = auVar194._8_4_;
              fVar173 = auVar194._12_4_;
              if ((int)uVar37 <= (int)uVar29) break;
              auVar80 = vsubps_avx(*(undefined1 (*) [16])*pauVar22,auVar94);
              auVar194._0_4_ = auVar194._0_4_ + auVar80._0_4_ * auVar80._0_4_;
              auVar194._4_4_ = fVar154 + auVar80._4_4_ * auVar80._4_4_;
              auVar194._8_4_ = fVar172 + auVar80._8_4_ * auVar80._8_4_;
              auVar194._12_4_ = fVar173 + auVar80._12_4_ * auVar80._12_4_;
              pauVar22 = (undefined1 (*) [32])(*pauVar22 + 0x10);
              uVar29 = uVar27 + 7;
              uVar27 = uVar27 + 4;
            }
            auVar57._0_4_ = auVar186._0_4_ + auVar186._16_4_;
            auVar57._4_4_ = auVar186._4_4_ + auVar186._20_4_;
            auVar57._8_4_ = auVar186._8_4_ + auVar186._24_4_;
            auVar57._12_4_ = auVar186._12_4_ + auVar186._28_4_;
            auVar80 = vshufpd_avx(auVar57,auVar57,1);
            auVar58._0_4_ = auVar80._0_4_ + auVar57._0_4_;
            auVar58._4_4_ = auVar80._4_4_ + auVar57._4_4_;
            auVar58._8_4_ = auVar80._8_4_ + auVar57._8_4_;
            auVar58._12_4_ = auVar80._12_4_ + auVar57._12_4_;
            auVar80 = vmovshdup_avx(auVar58);
            auVar82 = vshufpd_avx(auVar194,auVar194,1);
            auVar129._0_4_ = auVar194._0_4_ + auVar82._0_4_;
            auVar129._4_4_ = fVar154 + auVar82._4_4_;
            auVar129._8_4_ = fVar172 + auVar82._8_4_;
            auVar129._12_4_ = fVar173 + auVar82._12_4_;
            auVar82 = vmovshdup_avx(auVar129);
            fVar154 = auVar82._0_4_ +
                      auVar151._0_4_ + auVar80._0_4_ + auVar58._0_4_ + auVar129._0_4_;
            auVar151 = ZEXT464((uint)fVar154);
            if ((int)uVar27 < (int)uVar37) {
              uVar33 = CONCAT44(0,~uVar27 + uVar37);
              auVar59._8_8_ = 0;
              auVar59._0_8_ = uVar33;
              auVar81 = vpshufd_avx(auVar59,0x44);
              auVar80 = vorps_avx(auVar81,auVar95);
              auVar82 = vorps_avx(auVar81,auVar95);
              uVar32 = 0;
              auVar195 = ZEXT1664(CONCAT124(auVar195._4_12_,fVar154));
              do {
                auVar151 = auVar195;
                auVar60._8_8_ = 0;
                auVar60._0_8_ = uVar32;
                auVar106 = vpshufd_avx(auVar60,0x44);
                auVar72._16_16_ = auVar106;
                auVar72._0_16_ = auVar106;
                auVar119 = vorps_avx(auVar72,auVar17);
                auVar89 = vorps_avx(auVar72,auVar18);
                auVar106 = vorps_avx(auVar81,auVar95);
                auVar61._0_8_ = auVar89._16_8_ ^ 0x8000000000000000;
                auVar61._8_4_ = auVar89._24_4_;
                auVar61._12_4_ = auVar89._28_4_ ^ 0x80000000;
                auVar83 = vpcmpgtq_avx(auVar61,auVar106);
                auVar183._0_8_ = auVar89._0_8_ ^ 0x8000000000000000;
                auVar130._8_4_ = auVar89._8_4_;
                auVar183._8_4_ = auVar130._8_4_;
                auVar183._12_4_ = auVar89._12_4_ ^ 0x80000000;
                auVar107 = vpcmpgtq_avx(auVar183,auVar80);
                auVar107 = vpackssdw_avx(auVar107,auVar83);
                auVar85._0_8_ = auVar119._16_8_ ^ 0x8000000000000000;
                auVar85._8_4_ = auVar119._24_4_;
                auVar85._12_4_ = auVar119._28_4_ ^ 0x80000000;
                auVar108 = vpcmpgtq_avx(auVar85,auVar106);
                auVar86._0_8_ = auVar119._0_8_ ^ 0x8000000000000000;
                auVar86._8_4_ = auVar119._8_4_;
                auVar86._12_4_ = auVar119._12_4_ ^ 0x80000000;
                auVar106 = vpcmpgtq_avx(auVar86,auVar82);
                auVar106 = vpackssdw_avx(auVar106,auVar108);
                auVar106 = vpackssdw_avx(auVar106 ^ auVar96,auVar107 ^ auVar96);
                auVar107 = vpmovsxwd_avx(auVar106);
                auVar106 = vpunpckhwd_avx(auVar106,auVar106);
                auVar90._16_16_ = auVar106;
                auVar90._0_16_ = auVar107;
                auVar143 = vmaskmovps_avx(auVar90,*(undefined1 (*) [32])(*pauVar22 + uVar32 * 4));
                auVar143 = vsubps_avx(auVar143,auVar170);
                auVar184._0_4_ = auVar143._0_4_ * auVar143._0_4_ + auVar151._0_4_;
                auVar184._4_4_ = auVar143._4_4_ * auVar143._4_4_ + auVar151._4_4_;
                auVar184._8_4_ = auVar143._8_4_ * auVar143._8_4_ + auVar151._8_4_;
                auVar184._12_4_ = auVar143._12_4_ * auVar143._12_4_ + auVar151._12_4_;
                auVar187._16_4_ = auVar143._16_4_ * auVar143._16_4_ + auVar151._16_4_;
                auVar187._0_16_ = auVar184;
                auVar187._20_4_ = auVar143._20_4_ * auVar143._20_4_ + auVar151._20_4_;
                auVar187._24_4_ = auVar143._24_4_ * auVar143._24_4_ + auVar151._24_4_;
                auVar187._28_4_ = auVar143._28_4_ + auVar151._28_4_;
                uVar32 = uVar32 + 8;
                auVar195 = ZEXT3264(auVar187);
              } while ((uVar33 + 8 & 0x1fffffff8) != uVar32);
              auVar80 = vorps_avx(auVar81,auVar95);
              auVar130._0_8_ = auVar89._0_8_ ^ 0x8000000000000000;
              auVar130._12_4_ = auVar89._12_4_ ^ 0x80000000;
              auVar80 = vpcmpgtq_avx(auVar130,auVar80);
              auVar82 = vpackssdw_avx(auVar80,auVar83);
              auVar80 = vorps_avx(auVar81,auVar95);
              auVar131._0_8_ = auVar119._0_8_ ^ 0x8000000000000000;
              auVar131._8_4_ = auVar119._8_4_;
              auVar131._12_4_ = auVar119._12_4_ ^ 0x80000000;
              auVar80 = vpcmpgtq_avx(auVar131,auVar80);
              auVar80 = vpackssdw_avx(auVar80,auVar108);
              auVar80 = vblendvps_avx(auVar151._0_16_,auVar184,auVar80 ^ auVar96);
              auVar82 = vblendvps_avx(auVar151._16_16_,auVar187._16_16_,auVar82 ^ auVar96);
              auVar80 = vhaddps_avx(auVar82,auVar80);
              auVar80 = vhaddps_avx(auVar80,auVar80);
              auVar80 = vhaddps_avx(auVar80,auVar80);
              auVar151 = ZEXT1664(auVar80);
              auVar195 = ZEXT864(0);
            }
            fVar154 = auVar151._0_4_;
            uVar25 = uVar25 + 1;
          } while (uVar25 != uVar30);
          auVar151 = ZEXT1664(ZEXT416((uint)fVar171));
        }
      }
      fVar154 = fVar154 * fVar153 + *(float *)(&this->field_0xd8 + (long)local_80);
      auVar94 = vrsqrtss_avx(ZEXT416((uint)fVar154),ZEXT416((uint)fVar154));
      fVar171 = auVar94._0_4_;
      if (0 < (int)uVar20) {
        fVar154 = fVar171 * -0.5 * (fVar154 * fVar171 * fVar171 + -3.0);
        fVar171 = fVar154 * -auVar151._0_4_;
        uVar25 = 0;
        do {
          fVar173 = fVar154;
          fVar172 = fVar171;
          if (*(int *)(&this->field_0xdc + (long)pp_Var2[-3]) != 0) {
            fVar173 = fVar154 * *pfVar24;
            fVar172 = fVar171 * *pfVar24;
            auVar151 = ZEXT464((uint)fVar172);
            fVar172 = fVar172 + *pfVar41;
          }
          pauVar22 = (undefined1 (*) [32])((long)pvVar3 + uVar19 * uVar31 * uVar25 + lVar40);
          auVar94 = vshufps_avx(ZEXT416((uint)fVar173),ZEXT416((uint)fVar173),0);
          auVar80 = vshufps_avx(ZEXT416((uint)fVar172),ZEXT416((uint)fVar172),0);
          fVar173 = auVar80._0_4_;
          fVar174 = auVar80._4_4_;
          fVar175 = auVar80._8_4_;
          fVar176 = auVar80._12_4_;
          fVar177 = auVar94._0_4_;
          fVar169 = auVar94._4_4_;
          fVar144 = auVar94._8_4_;
          fVar172 = auVar94._12_4_;
          uVar27 = 0;
          if (7 < (int)uVar37) {
            iVar26 = 7;
            do {
              auVar91._0_4_ = fVar177 * *(float *)*pauVar22 + fVar173;
              auVar91._4_4_ = fVar169 * *(float *)(*pauVar22 + 4) + fVar174;
              auVar91._8_4_ = fVar144 * *(float *)(*pauVar22 + 8) + fVar175;
              auVar91._12_4_ = fVar172 * *(float *)(*pauVar22 + 0xc) + fVar176;
              auVar91._16_4_ = fVar177 * *(float *)(*pauVar22 + 0x10) + fVar173;
              auVar91._20_4_ = fVar169 * *(float *)(*pauVar22 + 0x14) + fVar174;
              auVar91._24_4_ = fVar144 * *(float *)(*pauVar22 + 0x18) + fVar175;
              auVar91._28_4_ = auVar151._28_4_ + fVar176;
              auVar151 = ZEXT3264(auVar91);
              *pauVar22 = auVar91;
              pauVar22 = pauVar22 + 1;
              iVar26 = iVar26 + 8;
              uVar27 = uVar21;
            } while (iVar26 < (int)uVar37);
          }
          uVar29 = uVar27 | 3;
          while ((int)uVar29 < (int)uVar37) {
            fVar152 = *(float *)(*pauVar22 + 4);
            fVar155 = *(float *)(*pauVar22 + 8);
            fVar156 = *(float *)(*pauVar22 + 0xc);
            *(float *)*pauVar22 = fVar173 + fVar177 * *(float *)*pauVar22;
            *(float *)(*pauVar22 + 4) = fVar174 + fVar169 * fVar152;
            *(float *)(*pauVar22 + 8) = fVar175 + fVar144 * fVar155;
            *(float *)(*pauVar22 + 0xc) = fVar176 + fVar172 * fVar156;
            pauVar22 = (undefined1 (*) [32])(*pauVar22 + 0x10);
            uVar29 = uVar27 + 7;
            uVar27 = uVar27 + 4;
          }
          if ((int)uVar27 < (int)uVar37) {
            uVar32 = CONCAT44(0,~uVar27 + uVar37);
            auVar62._8_8_ = 0;
            auVar62._0_8_ = uVar32;
            auVar82 = vpshufd_avx(auVar62,0x44);
            auVar94 = vorps_avx(auVar82,auVar95);
            auVar80 = vorps_avx(auVar82,auVar95);
            uVar33 = 0;
            do {
              auVar63._8_8_ = 0;
              auVar63._0_8_ = uVar33;
              auVar81 = vpshufd_avx(auVar63,0x44);
              auVar73._16_16_ = auVar81;
              auVar73._0_16_ = auVar81;
              auVar119 = vorps_avx(auVar73,auVar17);
              auVar89 = vorps_avx(auVar73,auVar18);
              auVar81 = vorps_avx(auVar82,auVar95);
              auVar132._0_8_ = auVar89._16_8_ ^ 0x8000000000000000;
              auVar132._8_4_ = auVar89._24_4_;
              auVar132._12_4_ = auVar89._28_4_ ^ 0x80000000;
              auVar106 = vpcmpgtq_avx(auVar132,auVar81);
              auVar64._0_8_ = auVar89._0_8_ ^ 0x8000000000000000;
              auVar64._8_4_ = auVar89._8_4_;
              auVar64._12_4_ = auVar89._12_4_ ^ 0x80000000;
              auVar107 = vpcmpgtq_avx(auVar64,auVar94);
              auVar106 = vpackssdw_avx(auVar107,auVar106);
              auVar133._0_8_ = auVar119._16_8_ ^ 0x8000000000000000;
              auVar133._8_4_ = auVar119._24_4_;
              auVar133._12_4_ = auVar119._28_4_ ^ 0x80000000;
              auVar81 = vpcmpgtq_avx(auVar133,auVar81);
              auVar87._0_8_ = auVar119._0_8_ ^ 0x8000000000000000;
              auVar87._8_4_ = auVar119._8_4_;
              auVar87._12_4_ = auVar119._12_4_ ^ 0x80000000;
              auVar107 = vpcmpgtq_avx(auVar87,auVar80);
              auVar81 = vpackssdw_avx(auVar107,auVar81);
              auVar81 = vpackssdw_avx(auVar81 ^ auVar96,auVar106 ^ auVar96);
              auVar106 = vpmovsxwd_avx(auVar81);
              auVar81 = vpunpckhwd_avx(auVar81,auVar81);
              auVar74._16_16_ = auVar81;
              auVar74._0_16_ = auVar106;
              auVar119 = vmaskmovps_avx(auVar74,*(undefined1 (*) [32])(*pauVar22 + uVar33 * 4));
              auVar92._0_4_ = fVar173 + fVar177 * auVar119._0_4_;
              auVar92._4_4_ = fVar174 + fVar169 * auVar119._4_4_;
              auVar92._8_4_ = fVar175 + fVar144 * auVar119._8_4_;
              auVar92._12_4_ = fVar176 + fVar172 * auVar119._12_4_;
              auVar92._16_4_ = fVar173 + fVar177 * auVar119._16_4_;
              auVar92._20_4_ = fVar174 + fVar169 * auVar119._20_4_;
              auVar92._24_4_ = fVar175 + fVar144 * auVar119._24_4_;
              auVar92._28_4_ = fVar176 + auVar119._28_4_;
              auVar151 = ZEXT3264(auVar92);
              auVar119 = vmaskmovps_avx(auVar74,auVar92);
              *(undefined1 (*) [32])(*pauVar22 + uVar33 * 4) = auVar119;
              uVar33 = uVar33 + 8;
            } while ((uVar32 + 8 & 0x1fffffff8) != uVar33);
          }
          pfVar24 = pfVar24 + 1;
          pfVar41 = pfVar41 + 1;
          uVar25 = uVar25 + 1;
        } while (uVar25 != uVar30);
        local_80 = pp_Var2[-3];
      }
      lVar38 = lVar38 + 1;
      p_Var34 = (_func_int *)((long)&this->_vptr_GroupNorm_x86_avx + (long)local_80);
    } while (lVar38 < *(int *)(&this->field_0xd0 + (long)local_80));
  }
  return 0;
}

Assistant:

int GroupNorm_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    const int dims = bottom_top_blob.dims;
    const int channels_per_group = channels / group;

    if (dims == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            float sum = 0.f;
            float* ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < channels_per_group; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < channels_per_group; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < channels_per_group; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / channels_per_group;

            float sqsum = 0.f;
            ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / channels_per_group + eps);
            float scale2 = -mean * scale1;

            ptr = bottom_top_blob_g;
            if (affine)
            {
                int i = 0;
                const float* gamma = gamma_data_g;
                const float* beta = beta_data_g;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _gamma = _mm512_loadu_ps(gamma);
                    __m512 _beta = _mm512_loadu_ps(beta);
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _a = _mm512_mul_ps(_gamma, _scale1_avx512);
                    __m512 _b = _mm512_add_ps(_mm512_mul_ps(_gamma, _scale2_avx512), _beta);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _a), _b);
                    _mm512_storeu_ps(ptr, _p);
                    gamma += 16;
                    beta += 16;
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _gamma = _mm256_loadu_ps(gamma);
                    __m256 _beta = _mm256_loadu_ps(beta);
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _a = _mm256_mul_ps(_gamma, _scale1_avx);
                    __m256 _b = _mm256_comp_fmadd_ps(_gamma, _scale2_avx, _beta);
                    _p = _mm256_comp_fmadd_ps(_p, _a, _b);
                    _mm256_storeu_ps(ptr, _p);
                    gamma += 8;
                    beta += 8;
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _gamma = _mm_loadu_ps(gamma);
                    __m128 _beta = _mm_loadu_ps(beta);
                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _a = _mm_mul_ps(_gamma, _scale1);
                    __m128 _b = _mm_comp_fmadd_ps(_gamma, _scale2, _beta);
                    _p = _mm_comp_fmadd_ps(_p, _a, _b);
                    _mm_storeu_ps(ptr, _p);
                    gamma += 4;
                    beta += 4;
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    float a = *gamma * scale1;
                    float b = *gamma * scale2 + *beta;
                    *ptr = *ptr * a + b;
                    gamma++;
                    beta++;
                    ptr++;
                }
            }
            else
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _scale1_avx512), _scale2_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _scale1_avx, _scale2_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _scale1, _scale2);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    *ptr = *ptr * scale1 + scale2;
                    ptr++;
                }
            }
        }

        return 0;
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;
        int size = channels_per_group * w;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.row_range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            float* ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < size; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < size; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < size; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / size;

            float sqsum = 0.f;
            ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / size + eps);
            float scale2 = -mean * scale1;

            ptr = bottom_top_blob_g;
            if (affine)
            {
                const float* gamma = gamma_data_g;
                const float* beta = beta_data_g;
                for (int q = 0; q < channels_per_group; q++)
                {
                    float a = *gamma * scale1;
                    float b = *gamma * scale2 + *beta;
                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    __m512 _a_avx512 = _mm512_set1_ps(a);
                    __m512 _b_avx512 = _mm512_set1_ps(b);
                    for (; i + 15 < w; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(ptr);
                        _p = _mm512_add_ps(_mm512_mul_ps(_p, _a_avx512), _b_avx512);
                        _mm512_storeu_ps(ptr, _p);
                        ptr += 16;
                    }
#endif // __AVX512F__
                    __m256 _a_avx = _mm256_set1_ps(a);
                    __m256 _b_avx = _mm256_set1_ps(b);
                    for (; i + 7 < w; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p, _a_avx, _b_avx);
                        _mm256_storeu_ps(ptr, _p);
                        ptr += 8;
                    }
#endif // __AVX__
                    __m128 _a = _mm_set1_ps(a);
                    __m128 _b = _mm_set1_ps(b);
                    for (; i + 3 < w; i += 4)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_comp_fmadd_ps(_p, _a, _b);
                        _mm_storeu_ps(ptr, _p);
                        ptr += 4;
                    }
#endif // __SSE2__
                    for (; i < w; i++)
                    {
                        *ptr = *ptr * a + b;
                        ptr++;
                    }
                    gamma++;
                    beta++;
                }
            }
            else
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _scale1_avx512), _scale2_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _scale1_avx, _scale2_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _scale1, _scale2);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *ptr = *ptr * scale1 + scale2;
                    ptr++;
                }
            }
        }

        return 0;
    }

    if (dims == 3 || dims == 4)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int d = bottom_top_blob.d;
        int size = w * h * d;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.channel_range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < size; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < size; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < size; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / (channels_per_group * size);

            float sqsum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / (channels_per_group * size) + eps);
            float scale2 = -mean * scale1;

            const float* gamma = gamma_data_g;
            const float* beta = beta_data_g;
            for (int q = 0; q < channels_per_group; q++)
            {
                float a = scale1;
                float b = scale2;
                if (affine)
                {
                    a = *gamma * a;
                    b = *gamma * b + *beta;
                }

                float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _a_avx512 = _mm512_set1_ps(a);
                __m512 _b_avx512 = _mm512_set1_ps(b);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _a_avx512), _b_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _a_avx = _mm256_set1_ps(a);
                __m256 _b_avx = _mm256_set1_ps(b);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _a_avx, _b_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _a = _mm_set1_ps(a);
                __m128 _b = _mm_set1_ps(b);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _a, _b);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *ptr = *ptr * a + b;
                    ptr++;
                }

                gamma++;
                beta++;
            }
        }

        return 0;
    }

    return 0;
}